

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

MIR_reg_t change_reg(gen_ctx_t gen_ctx,MIR_op_t *mem_op,MIR_reg_t reg,MIR_reg_t base_reg,
                    MIR_op_mode_t data_mode,MIR_insn_t insn,int out_p)

{
  VARR_MIR_reg_t *pVVar1;
  MIR_type_t type;
  MIR_reg_t hard_reg;
  MIR_reg_t temp_hard_reg;
  uint loc;
  
  pVVar1 = gen_ctx->ra_ctx->reg_renumber;
  if (((pVVar1 != (VARR_MIR_reg_t *)0x0) && (pVVar1->varr != (MIR_reg_t *)0x0)) &&
     ((ulong)reg < pVVar1->els_num)) {
    loc = pVVar1->varr[reg];
    if (0x21 < loc) {
      type = MIR_reg_type(gen_ctx->ctx,reg - 0x21,(gen_ctx->curr_func_item->u).func);
      hard_reg = get_reload_hreg(gen_ctx,reg,type,out_p);
      if ((out_p != 0) || (temp_hard_reg = hard_reg, type != MIR_T_I64)) {
        temp_hard_reg = get_reload_hreg(gen_ctx,0xffffffff,6,out_p);
      }
      if (0xfffffffb < *(int *)&insn->field_0x18 - 0x22U) goto LAB_0017295d;
      add_ld_st(gen_ctx,mem_op,loc,base_reg,data_mode,hard_reg,out_p,temp_hard_reg,insn,out_p);
      loc = hard_reg;
    }
    return loc;
  }
  change_reg_cold_1();
LAB_0017295d:
  __assert_fail("!MIR_addr_code_p (insn->code)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1e7e,
                "MIR_reg_t change_reg(gen_ctx_t, MIR_op_t *, MIR_reg_t, MIR_reg_t, MIR_op_mode_t, MIR_insn_t, int)"
               );
}

Assistant:

static MIR_reg_t change_reg (gen_ctx_t gen_ctx, MIR_op_t *mem_op, MIR_reg_t reg, MIR_reg_t base_reg,
                             MIR_op_mode_t data_mode, MIR_insn_t insn, int out_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_reg_t loc = VARR_GET (MIR_reg_t, reg_renumber, reg);
  if (loc <= MAX_HARD_REG) return loc;
  MIR_type_t type = MIR_reg_type (ctx, reg - MAX_HARD_REG, curr_func_item->u.func);
  MIR_reg_t reload_hreg = get_reload_hreg (gen_ctx, reg, type, out_p);
  MIR_reg_t temp_addr_hreg
    = (out_p || type != MIR_T_I64 ? get_reload_hreg (gen_ctx, MIR_NON_VAR, MIR_T_I64, out_p)
                                  : reload_hreg);
  gen_assert (!MIR_addr_code_p (insn->code));
  return add_ld_st (gen_ctx, mem_op, loc, base_reg, data_mode, reload_hreg, out_p, temp_addr_hreg,
                    insn, out_p);
}